

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifgtw(bifcxdef *ctx,int argc)

{
  ushort uVar1;
  uint err;
  long lVar2;
  long in_RDI;
  bifgtw_cb_ctx fnctx;
  runsdef val;
  int siz;
  int cnt;
  voccxdef *voc;
  prpnum prpn;
  objnum objn;
  int in_stack_ffffffffffffffbc;
  runcxdef *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uchar in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  anon_union_8_4_1dda36f5_for_runsv in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  err = (uint)*(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) == '\r') {
    uVar1 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    if ((1 < uVar1) && (uVar1 < 8)) {
      voc_count((voccxdef *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                (short)((ulong)in_stack_ffffffffffffffd8 >> 0x30),
                (short)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                (int *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if ((uint)((int)*(undefined8 *)(*(long *)(in_RDI + 8) + 0x40) -
                (int)*(undefined8 *)(*(long *)(in_RDI + 8) + 0x38)) <=
          (uint)(in_stack_ffffffffffffffe4 * 4 + 2 + in_stack_ffffffffffffffe0)) {
        runhcmp((runcxdef *)voc,cnt,siz,(runsdef *)val.runsv.runsvstr,
                (runsdef *)CONCAT26(val._6_2_,val._0_6_),(runsdef *)fnctx._8_8_);
      }
      lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x38) + 2;
      voc_iterate((voccxdef *)val.runsv.runsvstr,val._6_2_,
                  (_func_void_void_ptr_vocdef_ptr_vocwdef_ptr *)fnctx._8_8_,fnctx.p);
      oswp2(*(void **)(*(long *)(in_RDI + 8) + 0x38),
            (int)lVar2 - (int)*(undefined8 *)(*(long *)(in_RDI + 8) + 0x38));
      *(long *)(*(long *)(in_RDI + 8) + 0x38) = lVar2;
      runrepush(*(runcxdef **)(in_RDI + 8),(runsdef *)&stack0xffffffffffffffd0);
      return;
    }
    *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "delword";
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
    runsign(in_stack_ffffffffffffffc0,err);
  }
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
  runsign(in_stack_ffffffffffffffc0,err);
}

Assistant:

void bifgtw(bifcxdef *ctx, int argc)
{
    objnum    objn;
    prpnum    prpn;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    int       cnt;
    int       siz;
    runsdef   val;
    struct bifgtw_cb_ctx fnctx;

    bifcntargs(ctx, 2, argc);

    /* get the arguments */
    objn = runpopobj(ctx->bifcxrun);
    prpn = runpopprp(ctx->bifcxrun);
    
    /* make sure the property is a valid part of speech property */
    if (!prpisvoc(prpn))
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "delword");

    /* get the size of the list we'll need to build */
    voc_count(voc, objn, prpn, &cnt, &siz);

    /*
     *   calculate how much space it will take to make a list out of all
     *   these words: 2 bytes for the list length header; plus, for each
     *   entry, 1 byte for the type header, 2 bytes for the string size
     *   header, and possibly one extra byte for the two-word separator --
     *   a total of 4 bytes extra per word.  
     */
    siz += 2 + 4*cnt;

    /* reserve the space */
    runhres(ctx->bifcxrun, siz, 0);

    /* set up our callback context, and build the list */
    fnctx.p = ctx->bifcxrun->runcxhp + 2;
    fnctx.typ = prpn;
    voc_iterate(voc, objn, bifgtw_cb, &fnctx);

    /* set up the return value */
    val.runstyp = DAT_LIST;
    val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

    /* write the list length, and advance past the space we used */
    oswp2(ctx->bifcxrun->runcxhp, fnctx.p - ctx->bifcxrun->runcxhp);
    ctx->bifcxrun->runcxhp = fnctx.p;

    /* return the list */
    runrepush(ctx->bifcxrun, &val);
}